

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O0

void secp256k1_rangeproof_pub_expand
               (secp256k1_gej *pubs,int exp,size_t *rsizes,size_t rings,secp256k1_ge *genp)

{
  undefined1 local_148 [8];
  secp256k1_gej tmp;
  size_t npub;
  size_t j;
  size_t i;
  secp256k1_gej base;
  secp256k1_ge *genp_local;
  size_t rings_local;
  size_t *rsizes_local;
  int exp_local;
  secp256k1_gej *pubs_local;
  
  rsizes_local._4_4_ = exp;
  if (exp < 0) {
    rsizes_local._4_4_ = 0;
  }
  base._120_8_ = genp;
  secp256k1_gej_set_ge((secp256k1_gej *)&i,genp);
  secp256k1_gej_neg((secp256k1_gej *)&i,(secp256k1_gej *)&i);
  while (rsizes_local._4_4_ != 0) {
    secp256k1_gej_double_var((secp256k1_gej *)local_148,(secp256k1_gej *)&i,(secp256k1_fe *)0x0);
    secp256k1_gej_double_var((secp256k1_gej *)&i,(secp256k1_gej *)local_148,(secp256k1_fe *)0x0);
    secp256k1_gej_double_var((secp256k1_gej *)&i,(secp256k1_gej *)&i,(secp256k1_fe *)0x0);
    secp256k1_gej_add_var
              ((secp256k1_gej *)&i,(secp256k1_gej *)&i,(secp256k1_gej *)local_148,
               (secp256k1_fe *)0x0);
    rsizes_local._4_4_ = rsizes_local._4_4_ + -1;
  }
  tmp.infinity = 0;
  tmp._124_4_ = 0;
  for (j = 0; j < rings; j = j + 1) {
    for (npub = 1; npub < rsizes[j]; npub = npub + 1) {
      secp256k1_gej_add_var
                (pubs + tmp._120_8_ + npub,pubs + tmp._120_8_ + npub + -1,(secp256k1_gej *)&i,
                 (secp256k1_fe *)0x0);
    }
    if (j < rings - 1) {
      secp256k1_gej_double_var((secp256k1_gej *)&i,(secp256k1_gej *)&i,(secp256k1_fe *)0x0);
      secp256k1_gej_double_var((secp256k1_gej *)&i,(secp256k1_gej *)&i,(secp256k1_fe *)0x0);
    }
    tmp._120_8_ = rsizes[j] + tmp._120_8_;
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_rangeproof_pub_expand(secp256k1_gej *pubs,
 int exp, size_t *rsizes, size_t rings, const secp256k1_ge* genp) {
    secp256k1_gej base;
    size_t i;
    size_t j;
    size_t npub;
    VERIFY_CHECK(exp < 19);
    if (exp < 0) {
        exp = 0;
    }
    secp256k1_gej_set_ge(&base, genp);
    secp256k1_gej_neg(&base, &base);
    while (exp--) {
        /* Multiplication by 10 */
        secp256k1_gej tmp;
        secp256k1_gej_double_var(&tmp, &base, NULL);
        secp256k1_gej_double_var(&base, &tmp, NULL);
        secp256k1_gej_double_var(&base, &base, NULL);
        secp256k1_gej_add_var(&base, &base, &tmp, NULL);
    }
    npub = 0;
    for (i = 0; i < rings; i++) {
        for (j = 1; j < rsizes[i]; j++) {
            secp256k1_gej_add_var(&pubs[npub + j], &pubs[npub + j - 1], &base, NULL);
        }
        if (i < rings - 1) {
            secp256k1_gej_double_var(&base, &base, NULL);
            secp256k1_gej_double_var(&base, &base, NULL);
        }
        npub += rsizes[i];
    }
}